

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O3

hrgls_Status hrgls_APISetLogMessageMinimumLevel(hrgls_API api,hrgls_MessageLevel level)

{
  hrgls_Status hVar1;
  
  if (api != (hrgls_API)0x0) {
    hVar1 = hrgls::API::SetLogMessageMinimumLevel(api->api,level);
    return hVar1;
  }
  return 0x3ee;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APISetLogMessageMinimumLevel(hrgls_API api, hrgls_MessageLevel level)
  {
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    try {
      return api->api->SetLogMessageMinimumLevel(level);
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }